

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall
t_py_generator::generate_deserialize_struct
          (t_py_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  bool bVar1;
  ostream *poVar2;
  string sStack_88;
  string local_68;
  string local_48;
  
  bVar1 = is_immutable(&tstruct->super_t_type);
  if (bVar1) {
    t_generator::indent_abi_cxx11_(&local_68,&this->super_t_generator);
    poVar2 = std::operator<<(out,(string *)&local_68);
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2," = ");
    type_name_abi_cxx11_(&sStack_88,this,&tstruct->super_t_type);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_88);
    poVar2 = std::operator<<(poVar2,".read(iprot)");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_68,&this->super_t_generator);
    poVar2 = std::operator<<(out,(string *)&local_68);
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2," = ");
    type_name_abi_cxx11_(&sStack_88,this,&tstruct->super_t_type);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_88);
    poVar2 = std::operator<<(poVar2,"()");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,".read(iprot)");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void t_py_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct, string prefix) {
  if (is_immutable(tstruct)) {
    out << indent() << prefix << " = " << type_name(tstruct) << ".read(iprot)" << endl;
  } else {
    out << indent() << prefix << " = " << type_name(tstruct) << "()" << endl
        << indent() << prefix << ".read(iprot)" << endl;
  }
}